

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_client.c
# Opt level: O2

void uo_tcp_client_connect(uo_tcp_client *tcp_client)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uo_tcp_conn *tcp_conn;
  addrinfo *res;
  int opt_TCP_NODELAY;
  addrinfo hints;
  
  hints.ai_flags = 0;
  hints.ai_family = 0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_socktype = 1;
  hints.ai_protocol = 6;
  iVar1 = getaddrinfo(tcp_client->hostname,tcp_client->port,(addrinfo *)&hints,(addrinfo **)&res);
  if (iVar1 == 0) {
    iVar1 = socket(res->ai_family,1,6);
    if (iVar1 == -1) {
      uo_err("Unable to create socket.");
    }
    else {
      opt_TCP_NODELAY = 1;
      iVar2 = uo_setsockopt(iVar1,6,1,&opt_TCP_NODELAY,4);
      if (iVar2 == -1) {
        uo_err("Could not set TCP_NODELAY option.");
      }
      iVar2 = connect(iVar1,(sockaddr *)res->ai_addr,res->ai_addrlen);
      if (iVar2 != -1) {
        freeaddrinfo((addrinfo *)res);
        tcp_conn = uo_tcp_conn_create_for_client(iVar1,tcp_client);
        uo_tcp_conn_open(tcp_conn);
        return;
      }
      uo_err("Unable to connect socket.");
      close(iVar1);
    }
    freeaddrinfo((addrinfo *)res);
  }
  else {
    pcVar3 = gai_strerror(iVar1);
    uo_err("Unable to get specified service address. getaddrinfo: %s",pcVar3);
  }
  return;
}

Assistant:

void uo_tcp_client_connect(
    uo_tcp_client *tcp_client)
{
    struct addrinfo hints = {
        .ai_family = AF_UNSPEC,
        .ai_socktype = SOCK_STREAM,
        .ai_protocol = IPPROTO_TCP
    }, *res;

    int s = getaddrinfo(tcp_client->hostname, tcp_client->port, &hints, &res);
    if (s != 0)
        uo_err_goto(err_return, "Unable to get specified service address. getaddrinfo: %s", gai_strerror(s));

    int sockfd = socket(res->ai_family, SOCK_STREAM, IPPROTO_TCP);
    if (sockfd == -1)
        uo_err_goto(err_freeaddrinfo, "Unable to create socket.");

    int opt_TCP_NODELAY = true;
    if (uo_setsockopt(sockfd, IPPROTO_TCP, TCP_NODELAY, &opt_TCP_NODELAY, sizeof opt_TCP_NODELAY) == -1)
        uo_err("Could not set TCP_NODELAY option.");

    if (connect(sockfd, res->ai_addr, res->ai_addrlen) == -1)
        uo_err_goto(err_close, "Unable to connect socket.");

    freeaddrinfo(res);

    uo_tcp_conn *tcp_conn = uo_tcp_conn_create_for_client(sockfd, tcp_client);
    uo_tcp_conn_open(tcp_conn);

    return;

err_close:
    close(sockfd);

err_freeaddrinfo:
    freeaddrinfo(res);

err_return:;
}